

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void * __thiscall asmjit::Zone::_alloc(Zone *this,size_t size)

{
  Block *pBVar1;
  Block *pBVar2;
  ulong uVar3;
  Block *pBVar4;
  uint8_t *puVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  
  uVar8 = (ulong)this->_blockSize;
  if (this->_blockSize <= size) {
    uVar8 = size;
  }
  lVar6 = 1L << ((byte)this->_blockAlignmentShift & 0x3f);
  pBVar1 = this->_block;
  if ((pBVar1 != (Block *)Zone_zeroBlock) && (size <= (ulong)((long)this->_end - (long)this->_ptr)))
  {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
               ,0x6a,"curBlock == &Zone_zeroBlock || getRemainingSize() < size");
  }
  pBVar2 = pBVar1->next;
  if ((pBVar2 == (Block *)0x0) || (uVar3 = pBVar2->size, uVar3 < size)) {
    if (uVar8 <= -lVar6 - 0x21U) {
      pBVar4 = (Block *)malloc(uVar8 + lVar6 + 0x20);
      if (pBVar4 != (Block *)0x0) {
        pvVar7 = (void *)(-lVar6 & (ulong)(pBVar4->data + lVar6 + -1));
        pBVar4->prev = (Block *)0x0;
        pBVar4->next = (Block *)0x0;
        pBVar4->size = uVar8 + lVar6;
        if (pBVar1 != (Block *)Zone_zeroBlock) {
          pBVar4->prev = pBVar1;
          pBVar1->next = pBVar4;
          if (pBVar2 != (Block *)0x0) {
            pBVar4->next = pBVar2;
            pBVar2->prev = pBVar4;
          }
        }
        this->_block = pBVar4;
        this->_ptr = (uint8_t *)(size + (long)pvVar7);
        puVar5 = pBVar4->data + uVar8 + lVar6;
        goto LAB_00112ec5;
      }
    }
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = (void *)(-lVar6 & (ulong)(pBVar2->data + lVar6 + -1));
    this->_block = pBVar2;
    this->_ptr = (uint8_t *)(size + (long)pvVar7);
    puVar5 = pBVar2->data + uVar3;
LAB_00112ec5:
    this->_end = puVar5;
  }
  return pvVar7;
}

Assistant:

void* Zone::_alloc(size_t size) noexcept {
  Block* curBlock = _block;
  uint8_t* p;

  size_t blockSize = std::max<size_t>(_blockSize, size);
  size_t blockAlignment = getBlockAlignment();

  // The `_alloc()` method can only be called if there is not enough space
  // in the current block, see `alloc()` implementation for more details.
  ASMJIT_ASSERT(curBlock == &Zone_zeroBlock || getRemainingSize() < size);

  // If the `Zone` has been cleared the current block doesn't have to be the
  // last one. Check if there is a block that can be used instead of allocating
  // a new one. If there is a `next` block it's completely unused, we don't have
  // to check for remaining bytes.
  Block* next = curBlock->next;
  if (next && next->size >= size) {
    p = Utils::alignTo(next->data, blockAlignment);

    _block = next;
    _ptr = p + size;
    _end = next->data + next->size;

    return static_cast<void*>(p);
  }

  // Prevent arithmetic overflow.
  if (ASMJIT_UNLIKELY(blockSize > (~static_cast<size_t>(0) - sizeof(Block) - blockAlignment)))
    return nullptr;

  blockSize += blockAlignment;
  Block* newBlock = static_cast<Block*>(Internal::allocMemory(sizeof(Block) + blockSize));

  if (ASMJIT_UNLIKELY(!newBlock))
    return nullptr;

  // Align the pointer to `blockAlignment` and adjust the size of this block
  // accordingly. It's the same as using `blockAlignment - Utils::alignDiff()`,
  // just written differently.
  p = Utils::alignTo(newBlock->data, blockAlignment);
  newBlock->prev = nullptr;
  newBlock->next = nullptr;
  newBlock->size = blockSize;

  if (curBlock != &Zone_zeroBlock) {
    newBlock->prev = curBlock;
    curBlock->next = newBlock;

    // Does only happen if there is a next block, but the requested memory
    // can't fit into it. In this case a new buffer is allocated and inserted
    // between the current block and the next one.
    if (next) {
      newBlock->next = next;
      next->prev = newBlock;
    }
  }

  _block = newBlock;
  _ptr = p + size;
  _end = newBlock->data + blockSize;

  return static_cast<void*>(p);
}